

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UnboundedLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnboundedLiteral,slang::ast::Type_const&,slang::SourceRange>
          (BumpAllocator *this,Type *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  UnboundedLiteral *pUVar3;
  
  pUVar3 = (UnboundedLiteral *)allocate(this,0x30,8);
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pUVar3->super_Expression).kind = UnboundedLiteral;
  (pUVar3->super_Expression).type.ptr = args;
  (pUVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pUVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pUVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pUVar3->super_Expression).sourceRange.endLoc = SVar2;
  return pUVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }